

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManSolve2_rec(Cbs2_Man_t *p,int Level)

{
  Gia_Man_t *pGVar1;
  Cbs2_Man_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int local_54;
  int iPropHeadOld;
  int iDecLit2;
  int iDecLit;
  int iVar;
  int hLearn1;
  int hLearn0;
  int hClause;
  int iJustTail;
  int iJustHead;
  int iPropHead;
  Cbs2_Que_t *pQue;
  Gia_Obj_t *pVar;
  Cbs2_Man_t *pCStack_18;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  _iJustHead = &p->pClauses;
  iVar3 = (p->pProp).iHead;
  pVar._4_4_ = Level;
  pCStack_18 = p;
  iVar2 = Cbs2_QueIsEmpty(&p->pProp);
  if (iVar2 != 0) {
    __assert_fail("!Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x523,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  hLearn1 = Cbs2_ManPropagate2(pCStack_18,pVar._4_4_);
  p_local._4_4_ = hLearn1;
  if (hLearn1 == 0) {
    iVar2 = Cbs2_QueIsEmpty(&pCStack_18->pProp);
    if (iVar2 == 0) {
      __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x527,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
    }
    iVar3 = Cbs2_ManUpdateFrontier(pCStack_18,iVar3,&local_54);
    if (iVar3 == 0) {
      iVar3 = Abc_MaxInt((pCStack_18->Pars).nJustThis,
                         (pCStack_18->pJust).iTail - (pCStack_18->pJust).iHead);
      (pCStack_18->Pars).nJustThis = iVar3;
      iVar3 = Cbs2_ManCheckLimits(pCStack_18);
      if (iVar3 == 0) {
        iJustTail = (pCStack_18->pProp).iHead;
        hClause = (pCStack_18->pJust).iHead;
        hLearn0 = (pCStack_18->pJust).iTail;
        if ((pCStack_18->Pars).fUseHighest == 0) {
          __assert_fail("p->Pars.fUseHighest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x537,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
        }
        iDecLit2 = Cbs2_ManDecideHighest(pCStack_18);
        pQue = (Cbs2_Que_t *)Gia_ManObj(pCStack_18->pAig,iDecLit2);
        iVar3 = Cbs2_VarIsJust(pCStack_18,(Gia_Obj_t *)pQue,iDecLit2);
        if (iVar3 == 0) {
          __assert_fail("Cbs2_VarIsJust(p, pVar, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x53a,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
        }
        pGVar1 = pCStack_18->pAig;
        pGVar4 = Gia_ObjFanin0((Gia_Obj_t *)pQue);
        iVar3 = Gia_ObjRefNum(pGVar1,pGVar4);
        pGVar1 = pCStack_18->pAig;
        pGVar4 = Gia_ObjFanin1((Gia_Obj_t *)pQue);
        iVar2 = Gia_ObjRefNum(pGVar1,pGVar4);
        if (iVar2 < iVar3) {
          iVar3 = Gia_ObjFaninLit0((Gia_Obj_t *)pQue,iDecLit2);
          iPropHeadOld = Abc_LitNot(iVar3);
        }
        else {
          iVar3 = Gia_ObjFaninLit1((Gia_Obj_t *)pQue,iDecLit2);
          iPropHeadOld = Abc_LitNot(iVar3);
        }
        Cbs2_ManAssign(pCStack_18,iPropHeadOld,pVar._4_4_ + 1,0,0);
        iVar = Cbs2_ManSolve2_rec(pCStack_18,pVar._4_4_ + 1);
        if (iVar == 0) {
          p_local._4_4_ = 0;
        }
        else {
          iVar3 = _iJustHead->pData[iVar + 1];
          iVar2 = Abc_Lit2Var(iPropHeadOld);
          if (iVar3 == iVar2) {
            Cbs2_ManCancelUntil(pCStack_18,iJustTail);
            Cbs2_QueRestore(&pCStack_18->pJust,hClause,hLearn0);
            p_00 = pCStack_18;
            iVar3 = Abc_LitNot(iPropHeadOld);
            Cbs2_ManAssign(p_00,iVar3,pVar._4_4_ + 1,0,0);
            iDecLit = Cbs2_ManSolve2_rec(pCStack_18,pVar._4_4_ + 1);
            if (iDecLit == 0) {
              p_local._4_4_ = 0;
            }
            else {
              iVar3 = _iJustHead->pData[iDecLit + 1];
              iVar2 = Abc_Lit2Var(iPropHeadOld);
              if (iVar3 == iVar2) {
                hLearn1 = Cbs2_ManResolve(pCStack_18,pVar._4_4_,iVar,iDecLit);
                Cbs2_ManBumpClause(pCStack_18,hLearn1);
                (pCStack_18->Pars).nBTThis = (pCStack_18->Pars).nBTThis + 1;
                p_local._4_4_ = hLearn1;
              }
              else {
                p_local._4_4_ = iDecLit;
              }
            }
          }
          else {
            p_local._4_4_ = iVar;
          }
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cbs2_ManSolve2_rec( Cbs2_Man_t * p, int Level )
{ 
    Gia_Obj_t * pVar;
    Cbs2_Que_t * pQue = &(p->pClauses);
    int iPropHead, iJustHead, iJustTail;
    int hClause, hLearn0, hLearn1, iVar, iDecLit, iDecLit2;
    int iPropHeadOld = p->pProp.iHead;
    // propagate assignments
    assert( !Cbs2_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs2_ManPropagate2( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs2_QueIsEmpty(&p->pProp) );
//    if ( Cbs2_QueIsEmpty(&p->pJust) )
//        return 0;
    if ( Cbs2_ManUpdateFrontier(p, iPropHeadOld, &iDecLit2) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs2_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
//    Cbs2_QueStore( &p->pJust, &iJustHead, &iJustTail );
    iJustHead = p->pJust.iHead;
    iJustTail = p->pJust.iTail;
    // find the decision variable

    assert( p->Pars.fUseHighest );
    iVar = Cbs2_ManDecideHighest( p );
    pVar = Gia_ManObj( p->pAig, iVar );
    assert( Cbs2_VarIsJust(p, pVar, iVar) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
//    if ( Vec_IntEntry(&p->vActivity, Gia_ObjFaninId0(pVar, iVar)) > Vec_IntEntry(&p->vActivity, Gia_ObjFaninId1(pVar, iVar)) )
        iDecLit = Abc_LitNot(Gia_ObjFaninLit0(pVar, iVar));
    else
        iDecLit = Abc_LitNot(Gia_ObjFaninLit1(pVar, iVar));

    //iDecLit = iDecLit2;

    // decide on first fanin
    Cbs2_ManAssign( p, iDecLit, Level+1, 0, 0 );
    if ( !(hLearn0 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0+1] != Abc_Lit2Var(iDecLit) )
        return hLearn0;
    Cbs2_ManCancelUntil( p, iPropHead );
    Cbs2_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs2_ManAssign( p, Abc_LitNot(iDecLit), Level+1, 0, 0 );
    if ( !(hLearn1 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1+1] != Abc_Lit2Var(iDecLit) )
        return hLearn1;
    hClause = Cbs2_ManResolve( p, Level, hLearn0, hLearn1 );
    Cbs2_ManBumpClause( p, hClause );
    //Cbs2_ManPrintCube( p, Level, hClause );
//    if ( Level > Cbs2_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}